

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O1

int32_t __thiscall
icu_63::UnicodeSetStringSpan::spanNotBack(UnicodeSetStringSpan *this,UChar *s,int32_t length)

{
  UChar *pUVar1;
  short *psVar2;
  short *psVar3;
  UChar UVar4;
  ushort uVar5;
  uint uVar6;
  bool bVar7;
  UBool UVar8;
  uint length_00;
  int iVar9;
  void *pvVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  uint local_40;
  
  uVar6 = this->strings->count;
  length_00 = length;
  do {
    length_00 = UnicodeSet::spanBack(this->pSpanNotSet,s,length_00,USET_SPAN_NOT_CONTAINED);
    if (length_00 == 0) {
      return 0;
    }
    UVar4 = s[(long)(int)length_00 + -1];
    if ((((int)length_00 < 2) || (((ushort)UVar4 & 0xfc00) != 0xdc00)) ||
       ((s[(ulong)length_00 - 2] & 0xfc00U) != 0xd800)) {
      UVar8 = UnicodeSet::contains(&this->spanSet,(uint)(ushort)UVar4);
      uVar16 = -(uint)(UVar8 == '\0') | 1;
    }
    else {
      UVar8 = UnicodeSet::contains
                        (&this->spanSet,
                         (uint)(ushort)UVar4 + (uint)(ushort)s[(ulong)length_00 - 2] * 0x400 +
                         -0x35fdc00);
      uVar16 = (uint)(UVar8 != '\0') * 4 - 2;
    }
    if ((int)uVar16 < 1) {
      if (0 < (int)uVar6) {
        uVar12 = 0;
        do {
          if (this->spanLengths[uVar12] != 0xff) {
            pvVar10 = UVector::elementAt(this->strings,(int32_t)uVar12);
            uVar5 = *(ushort *)((long)pvVar10 + 8);
            if ((uVar5 & 0x11) == 0) {
              if ((uVar5 & 2) == 0) {
                lVar13 = *(long *)((long)pvVar10 + 0x18);
              }
              else {
                lVar13 = (long)pvVar10 + 10;
              }
            }
            else {
              lVar13 = 0;
            }
            if ((short)uVar5 < 0) {
              iVar9 = *(int *)((long)pvVar10 + 0xc);
            }
            else {
              iVar9 = (int)(short)uVar5 >> 5;
            }
            iVar11 = length_00 - iVar9;
            if ((int)length_00 < iVar9) {
LAB_002e1351:
              bVar7 = true;
            }
            else {
              pUVar1 = s + iVar11;
              lVar14 = 0;
              iVar15 = iVar9;
              do {
                psVar2 = (short *)((long)pUVar1 + lVar14);
                psVar3 = (short *)(lVar13 + lVar14);
                if (*psVar2 != *psVar3) break;
                lVar14 = lVar14 + 2;
                bVar7 = 1 < iVar15;
                iVar15 = iVar15 + -1;
              } while (bVar7);
              if (((*psVar2 != *psVar3) ||
                  (((0 < iVar11 && ((pUVar1[-1] & 0xfc00U) == 0xd800)) &&
                   ((*pUVar1 & 0xfc00U) == 0xdc00)))) ||
                 (((iVar9 < length - iVar11 && ((pUVar1[(long)iVar9 + -1] & 0xfc00U) == 0xd800)) &&
                  ((pUVar1[iVar9] & 0xfc00U) == 0xdc00)))) goto LAB_002e1351;
              bVar7 = false;
              local_40 = length_00;
            }
            if (!bVar7) {
              bVar7 = false;
              goto LAB_002e137c;
            }
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar6);
      }
      length_00 = length_00 + uVar16;
      bVar7 = true;
    }
    else {
      bVar7 = false;
      local_40 = length_00;
    }
LAB_002e137c:
    if (!bVar7) {
      return local_40;
    }
    if (length_00 == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

int32_t UnicodeSetStringSpan::spanNotBack(const UChar *s, int32_t length) const {
    int32_t pos=length;
    int32_t i, stringsLength=strings.size();
    do {
        // Span until we find a code point from the set,
        // or a code point that starts or ends some string.
        pos=pSpanNotSet->spanBack(s, pos, USET_SPAN_NOT_CONTAINED);
        if(pos==0) {
            return 0;  // Reached the start of the string.
        }

        // Check whether the current code point is in the original set,
        // without the string starts and ends.
        int32_t cpLength=spanOneBack(spanSet, s, pos);
        if(cpLength>0) {
            return pos;  // There is a set element at pos.
        }

        // Try to match the strings at pos.
        for(i=0; i<stringsLength; ++i) {
            // Use spanLengths rather than a spanBackLengths pointer because
            // it is easier and we only need to know whether the string is irrelevant
            // which is the same in either array.
            if(spanLengths[i]==ALL_CP_CONTAINED) {
                continue;  // Irrelevant string.
            }
            const UnicodeString &string=*(const UnicodeString *)strings.elementAt(i);
            const UChar *s16=string.getBuffer();
            int32_t length16=string.length();
            if(length16<=pos && matches16CPB(s, pos-length16, length, s16, length16)) {
                return pos;  // There is a set element at pos.
            }
        }

        // The span(while not contained) ended on a string start/end which is
        // not in the original set. Skip this code point and continue.
        // cpLength<0
        pos+=cpLength;
    } while(pos!=0);
    return 0;  // Reached the start of the string.
}